

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TennisTest.cpp
# Opt level: O0

void __thiscall
TennisTest_ScoresAreZeroAtStart_Test::TestBody(TennisTest_ScoresAreZeroAtStart_Test *this)

{
  bool bVar1;
  char *message;
  AssertHelper local_68;
  Message local_60 [3];
  undefined1 local_48 [8];
  AssertionResult gtest_ar;
  string score;
  Tennis t1;
  TennisTest_ScoresAreZeroAtStart_Test *this_local;
  
  Tennis::score_abi_cxx11_
            ((string *)&gtest_ar.message_,(Tennis *)(score.field_2._M_local_buf + 0xf));
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,char[30]>
            ((EqHelper<false> *)local_48,"score","\"Player 1: love Player 2: love\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&gtest_ar.message_
             ,(char (*) [30])"Player 1: love Player 2: love");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(local_60);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jmossberg[P]tenniskatacpp/test/TennisTest.cpp"
               ,0xe,message);
    testing::internal::AssertHelper::operator=(&local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  std::__cxx11::string::~string((string *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(TennisTest, ScoresAreZeroAtStart)
{
    //Setup
    Tennis t1;

    //Execute
    std::string score = t1.score();

    //Verify
    //Zero points are called "love" in a Tennis game
    ASSERT_EQ(score, "Player 1: love Player 2: love");
}